

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakWarningThreadSafe_turnOnThreadSafeNewDeleteOverloadsDebug_Test::
~TEST_MemoryLeakWarningThreadSafe_turnOnThreadSafeNewDeleteOverloadsDebug_Test
          (TEST_MemoryLeakWarningThreadSafe_turnOnThreadSafeNewDeleteOverloadsDebug_Test *this)

{
  TEST_MemoryLeakWarningThreadSafe_turnOnThreadSafeNewDeleteOverloadsDebug_Test *this_local;
  
  ~TEST_MemoryLeakWarningThreadSafe_turnOnThreadSafeNewDeleteOverloadsDebug_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MemoryLeakWarningThreadSafe, turnOnThreadSafeNewDeleteOverloadsDebug)
{
    size_t storedAmountOfLeaks = MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all);

    MemoryLeakWarningPlugin::turnOnThreadSafeNewDeleteOverloads();

    int *n = new int;
    char *str = new char[20];

    LONGS_EQUAL(storedAmountOfLeaks + 2, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all));
    CHECK_EQUAL(2, mutexLockCount);
    CHECK_EQUAL(2, mutexUnlockCount);

    delete [] str;
    delete n;

    LONGS_EQUAL(storedAmountOfLeaks, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all));
    CHECK_EQUAL(4, mutexLockCount);
    CHECK_EQUAL(4, mutexUnlockCount);

    MemoryLeakWarningPlugin::turnOnDefaultNotThreadSafeNewDeleteOverloads();
}